

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O0

void __thiscall ObjLoader::loadImage(ObjLoader *this,string *texture_filename)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  char *filename;
  undefined1 local_80 [8];
  Image<unsigned_char> image;
  undefined1 local_38 [8];
  string key;
  string *texture_filename_local;
  ObjLoader *this_local;
  
  key.field_2._8_8_ = texture_filename;
  std::__cxx11::string::string((string *)local_38,texture_filename);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (texture_filename);
  if ((sVar2 != 0) && (bVar1 = NamedTextureImages::find(&this->m_images,(string *)local_38), !bVar1)
     ) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image.data,
                   &this->m_rootDir,texture_filename);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (texture_filename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image.data);
    std::__cxx11::string::~string((string *)&image.data);
    bVar1 = fileExists(texture_filename);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to find file: ");
      poVar3 = std::operator<<(poVar3,(string *)texture_filename);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    Image<unsigned_char>::Image((Image<unsigned_char> *)local_80);
    image.width = 1;
    filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(texture_filename);
    image._8_8_ = stbi_load(filename,(int *)local_80,(int *)(local_80 + 4),&image.height,0);
    if ((stbi_uc *)image._8_8_ == (stbi_uc *)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to load texture: ");
      poVar3 = std::operator<<(poVar3,(string *)texture_filename);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    NamedTextureImages::add(&this->m_images,(string *)local_38,(Image<unsigned_char> *)local_80);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ObjLoader::loadImage(std::string texture_filename)
{
  std::string key = texture_filename;
  if (texture_filename.length() > 0) {
    // Only load the texture if it is not already loaded
    if (not m_images.find(key)) {
      texture_filename = m_rootDir + texture_filename;
      if (!fileExists(texture_filename)) {
        std::cerr << "Unable to find file: " << texture_filename << std::endl;
        exit(1);
      }

      Image<> image;
      image.depth = 1;
      image.data = stbi_load(texture_filename.c_str(), &image.width, &image.height, &image.channels, STBI_default);
      if (!image.data) {
        std::cerr << "Unable to load texture: " << texture_filename << std::endl;
        exit(1);
      }
      m_images.add(key, image);
    }
  }
}